

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O0

size_t count_textures(aiScene *scene)

{
  aiMaterial *this;
  uint uVar1;
  ulong local_30;
  size_t tt;
  aiMaterial *mat;
  size_t i;
  size_t count;
  aiScene *scene_local;
  
  i = 0;
  for (mat = (aiMaterial *)0x0; mat < (aiMaterial *)(ulong)scene->mNumMaterials;
      mat = (aiMaterial *)((long)&mat->mProperties + 1)) {
    this = scene->mMaterials[(long)mat];
    for (local_30 = 1; local_30 < 0x12; local_30 = local_30 + 1) {
      uVar1 = aiMaterial::GetTextureCount(this,(aiTextureType)local_30);
      if (uVar1 != 0) {
        i = i + 1;
      }
    }
  }
  return i;
}

Assistant:

size_t count_textures(const aiScene* scene) {
    size_t count = 0;
    for (size_t i = 0; i < scene->mNumMaterials; ++i) {
        aiMaterial* mat = scene->mMaterials[i];
        for (
            size_t tt = aiTextureType_DIFFUSE;
            tt < aiTextureType_UNKNOWN;
            ++tt
        ){
            // TODO: handle layered textures
            if (mat->GetTextureCount(static_cast<aiTextureType>(tt)) > 0) {
                count += 1;
            }
        }
    }
    return count;
}